

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_signed_data_unittest.cc
# Opt level: O3

void bssl::anon_unknown_0::RunTestCase
               (VerifyResult expected_result,char *file_name,SignatureVerifyCache *cache)

{
  Input public_key_spki;
  Input input;
  Input signed_data_00;
  Input algorithm_identifier;
  long *plVar1;
  optional<bssl::SignatureAlgorithm> oVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  char *message;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  bool result;
  bool expected_result_bool;
  optional<bssl::der::BitString> signature_value_bit_string;
  Parser signature_value_parser;
  string path;
  string public_key;
  string signature_value;
  string signed_data;
  string algorithm;
  PemBlockMapping mappings [4];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b8;
  AssertHelper local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  AssertHelper local_178;
  undefined1 local_170 [32];
  Parser local_150;
  string local_138;
  string local_118;
  uchar *local_f8;
  size_t local_f0;
  uchar local_e8;
  undefined7 uStack_e7;
  uchar *local_d8;
  size_t local_d0;
  uchar local_c8;
  undefined7 uStack_c7;
  uchar *local_b8;
  size_t local_b0;
  uchar local_a8;
  undefined7 uStack_a7;
  PemBlockMapping local_98;
  char *local_80;
  uchar **local_78;
  undefined1 local_70;
  char *local_68;
  uchar **local_60;
  undefined1 local_58;
  char *local_50;
  uchar **local_48;
  undefined1 local_40;
  
  local_98.block_name = &local_98.optional;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"testdata/verify_signed_data_unittest/","");
  plVar1 = (long *)::std::__cxx11::string::append((char *)&local_98);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_138.field_2._M_allocated_capacity = *psVar3;
    local_138.field_2._8_8_ = plVar1[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar3;
    local_138._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_138._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((bool *)local_98.block_name != &local_98.optional) {
    operator_delete(local_98.block_name,CONCAT71(local_98._17_7_,local_98.optional) + 1);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_b0 = 0;
  local_a8 = '\0';
  local_d0 = 0;
  local_c8 = '\0';
  local_f0 = 0;
  local_e8 = '\0';
  local_98.block_name = "PUBLIC KEY";
  local_98.value = &local_118;
  local_98.optional = false;
  local_80 = "ALGORITHM";
  local_78 = &local_b8;
  local_70 = 0;
  local_68 = "DATA";
  local_60 = &local_d8;
  local_58 = 0;
  local_50 = "SIGNATURE";
  local_48 = &local_f8;
  local_40 = 0;
  local_f8 = &local_e8;
  local_d8 = &local_c8;
  local_b8 = &local_a8;
  ReadTestDataFromPemFile((bssl *)local_198,&local_138,&local_98,4);
  if (local_198[0] == (bssl)0x0) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)local_198,
               (AssertionResult *)"ReadTestDataFromPemFile(path, mappings)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
               ,0x43,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
      operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
    }
LAB_0046328f:
    if ((long *)local_150.cbs_.data != (long *)0x0) {
      (**(code **)(*(long *)local_150.cbs_.data + 8))();
    }
LAB_0046329a:
    if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_190,local_190);
    }
  }
  else {
    if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_190,local_190);
    }
    algorithm_identifier.data_.size_ = local_b0;
    algorithm_identifier.data_.data_ = local_b8;
    oVar2 = ParseSignatureAlgorithm(algorithm_identifier);
    local_198[0] = oVar2.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
                   super__Optional_payload_base<bssl::SignatureAlgorithm>._M_engaged;
    local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (((ulong)oVar2.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
                super__Optional_payload_base<bssl::SignatureAlgorithm> >> 0x20 & 1) == 0) {
      this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190;
      testing::Message::Message((Message *)&local_150);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_170,(internal *)local_198,(AssertionResult *)"signature_algorithm",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
                 ,0x47,(char *)local_170._0_8_);
      testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
        operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
      }
      __ptr_00 = local_190;
      if ((long *)local_150.cbs_.data != (long *)0x0) {
        (**(code **)(*(long *)local_150.cbs_.data + 8))();
        __ptr_00 = local_190;
      }
    }
    else {
      input.data_.size_ = local_f0;
      input.data_.data_ = local_f8;
      bssl::der::Parser::Parser(&local_150,input);
      bssl::der::Parser::ReadBitString((optional<bssl::der::BitString> *)local_170,&local_150);
      local_1b0.data_._0_1_ = (internal)local_170[0x18];
      local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_170[0x18] != false) {
        local_178.data_._0_1_ = expected_result == SUCCESS;
        signed_data_00.data_.size_ = local_d0;
        signed_data_00.data_.data_ = local_d8;
        public_key_spki.data_.size_ = local_118._M_string_length;
        public_key_spki.data_.data_ = (uchar *)local_118._M_dataplus._M_p;
        local_199 = VerifySignedData(oVar2.
                                     super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                                     _M_payload.
                                     super__Optional_payload_base<bssl::SignatureAlgorithm>.
                                     _M_payload,signed_data_00,(BitString *)local_170,
                                     public_key_spki,cache);
        testing::internal::CmpHelperEQ<bool,bool>
                  ((internal *)local_198,"expected_result_bool","result",(bool *)&local_178,
                   &local_199);
        if (local_198[0] == (bssl)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          if (local_190 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = "";
          }
          else {
            message = (local_190->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
                     ,0x55,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1b8,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b8);
          local_150.cbs_.data = (uint8_t *)CONCAT71(local_1b0.data_._1_7_,local_1b0.data_._0_1_);
          goto LAB_0046328f;
        }
        goto LAB_0046329a;
      }
      this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1a8;
      testing::Message::Message((Message *)&local_1b8);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8._M_head_impl + 0x10),
                 "The signature value is not a valid BIT STRING",0x2d);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,(internal *)&local_1b0,
                 (AssertionResult *)"signature_value_bit_string.has_value()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
                 ,0x4c,(char *)CONCAT71(local_198._1_7_,local_198[0]));
      testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_198._1_7_,local_198[0]) != &local_188) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_198._1_7_,local_198[0]),
                        local_188._M_allocated_capacity + 1);
      }
      __ptr_00 = local_1a8;
      if (local_1b8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1b8._M_head_impl + 8))();
        __ptr_00 = local_1a8;
      }
    }
    if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this,__ptr_00);
    }
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RunTestCase(VerifyResult expected_result, const char *file_name,
                 SignatureVerifyCache *cache) {
  std::string path =
      std::string("testdata/verify_signed_data_unittest/") + file_name;

  std::string public_key;
  std::string algorithm;
  std::string signed_data;
  std::string signature_value;

  const PemBlockMapping mappings[] = {
      {"PUBLIC KEY", &public_key},
      {"ALGORITHM", &algorithm},
      {"DATA", &signed_data},
      {"SIGNATURE", &signature_value},
  };

  ASSERT_TRUE(ReadTestDataFromPemFile(path, mappings));

  std::optional<SignatureAlgorithm> signature_algorithm =
      ParseSignatureAlgorithm(StringAsBytes(algorithm));
  ASSERT_TRUE(signature_algorithm);

  der::Parser signature_value_parser(StringAsBytes(signature_value));
  std::optional<der::BitString> signature_value_bit_string =
      signature_value_parser.ReadBitString();
  ASSERT_TRUE(signature_value_bit_string.has_value())
      << "The signature value is not a valid BIT STRING";

  bool expected_result_bool = expected_result == SUCCESS;

  bool result = VerifySignedData(
      *signature_algorithm, StringAsBytes(signed_data),
      signature_value_bit_string.value(), StringAsBytes(public_key), cache);

  EXPECT_EQ(expected_result_bool, result);
}